

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O3

void __thiscall DDecalFader::Tick(DDecalFader *this)

{
  int iVar1;
  DBaseDecal *pDVar2;
  int iVar3;
  double dVar4;
  
  pDVar2 = (this->super_DDecalThinker).TheDecal.field_0.p;
  if (pDVar2 != (DBaseDecal *)0x0) {
    if (((pDVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
      if ((this->TimeToStartDecay <= level.maptime) && ((bglobal._16_1_ & 1) == 0)) {
        iVar1 = this->TimeToEndDecay;
        iVar3 = iVar1 - level.maptime;
        if (iVar3 == 0 || iVar1 < level.maptime) {
          (*(pDVar2->super_DThinker).super_DObject._vptr_DObject[4])();
          goto LAB_00376fb7;
        }
        dVar4 = this->StartTrans;
        if ((dVar4 == -1.0) && (!NAN(dVar4))) {
          dVar4 = pDVar2->Alpha;
          this->StartTrans = dVar4;
        }
        pDVar2->Alpha = ((double)iVar3 * dVar4) / (double)(iVar1 - this->TimeToStartDecay);
      }
      return;
    }
    (this->super_DDecalThinker).TheDecal.field_0.p = (DBaseDecal *)0x0;
  }
LAB_00376fb7:
  (*(this->super_DDecalThinker).super_DThinker.super_DObject._vptr_DObject[4])(this);
  return;
}

Assistant:

void DDecalFader::Tick ()
{
	if (TheDecal == NULL)
	{
		Destroy ();
	}
	else
	{
		if (level.maptime < TimeToStartDecay || bglobal.freeze)
		{
			return;
		}
		else if (level.maptime >= TimeToEndDecay)
		{
			TheDecal->Destroy ();		// remove the decal
			Destroy ();					// remove myself
			return;
		}
		if (StartTrans == -1)
		{
			StartTrans = TheDecal->Alpha;
		}

		int distanceToEnd = TimeToEndDecay - level.maptime;
		int fadeDistance = TimeToEndDecay - TimeToStartDecay;
		TheDecal->Alpha = StartTrans * distanceToEnd / fadeDistance;
	}
}